

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type * __thiscall duckdb::Deserializer::Read<duckdb::vector<long,true>>(Deserializer *this)

{
  ulong uVar1;
  value_type_conflict5 *__x;
  long *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  idx_t i;
  idx_t size;
  vector<long,_true> *vec;
  vector<long,_std::allocator<long>_> *this_00;
  undefined8 local_38;
  
  this_00 = in_RDI;
  vector<long,_true>::vector((vector<long,_true> *)0xa70e7f);
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
    __x = (value_type_conflict5 *)Read<long>((Deserializer *)0xa70ebd);
    ::std::vector<long,_std::allocator<long>_>::push_back(this_00,__x);
  }
  (**(code **)(*in_RSI + 0x48))();
  return (type *)in_RDI;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}